

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O3

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>*,std::vector<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>,std::allocator<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>>>>,presolve::HPresolve::liftingForProbing(presolve::HighsPostsolveStack&)::__4,false>
               (__normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
                begin,__normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
                      end,anon_class_8_1_d757357c comp,int bad_allowed,bool leftmost)

{
  _Head_base<3UL,_int,_false> _Var1;
  bool bVar2;
  int iVar3;
  __normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
  _Var4;
  long lVar5;
  __normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
  _Var6;
  _Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
  *p_Var7;
  ulong uVar8;
  pointer ppVar9;
  tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
  *ptVar10;
  _Head_base<0UL,_int,_false> *p_Var11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  _Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
  *p_Var15;
  __normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
  b;
  _Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
  *p_Var16;
  double score1;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar24;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar25;
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  double dVar31;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_presolve_HPresolve_cpp:1830:7)>
  __cmp;
  long local_c8;
  tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
  local_b8;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_presolve_HPresolve_cpp:1830:7)>
  local_80;
  __normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
  local_78;
  int local_6c;
  pointer local_68;
  pointer ppStack_60;
  tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
  *local_58;
  ulong local_50;
  __normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
  local_48;
  __normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
  local_40;
  _Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
  *local_38;
  
  uVar13 = (long)end._M_current - (long)begin._M_current;
  local_6c = bad_allowed;
  if ((long)uVar13 < 0x480) {
    if (!leftmost) {
LAB_0031bdc6:
      if (begin._M_current == end._M_current) {
        return;
      }
      if (&(begin._M_current)->
           super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
          + 1 == &(end._M_current)->
                  super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
         ) {
        return;
      }
      p_Var7 = &(begin._M_current)->
                super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
               + 1;
      do {
        p_Var16 = p_Var7;
        local_b8.
        super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        .
        super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        .super__Tuple_impl<2UL,_double,_int>.super__Head_base<2UL,_double,_false>._M_head_impl =
             (((_Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                *)&(&(begin._M_current)->
                     super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                   )[1].
                   super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              )->
             super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
             ).super__Tuple_impl<2UL,_double,_int>.super__Head_base<2UL,_double,_false>._M_head_impl
        ;
        local_b8.
        super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        .
        super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        .
        super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
        ._M_head_impl.
        super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             *(pointer *)
              ((long)&(((_Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                         *)&(&(begin._M_current)->
                              super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                            )[1].
                            super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                       )->
                      super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                      ).
                      super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                      ._M_head_impl.
                      super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                      ._M_impl.super__Vector_impl_data + 8);
        local_b8.
        super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        .
        super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        .
        super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
        ._M_head_impl.
        super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (((_Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                *)&(&(begin._M_current)->
                     super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                   )[1].
                   super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              )->
             super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
             ).
             super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
             ._M_head_impl.
             super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_b8.
        super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        .
        super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        .super__Tuple_impl<2UL,_double,_int>.super__Tuple_impl<3UL,_int>.
        super__Head_base<3UL,_int,_false>._M_head_impl =
             (_Head_base<3UL,_int,_false>)
             (((_Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                *)&(&(begin._M_current)->
                     super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                   )[1].
                   super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              )->
             super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
             ).super__Tuple_impl<2UL,_double,_int>.super__Tuple_impl<3UL,_int>.
             super__Head_base<3UL,_int,_false>._M_head_impl;
        iVar3 = (int)((ulong)((long)local_b8.
                                    super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                    .
                                    super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                    .
                                    super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                    ._M_head_impl.
                                    super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_b8.
                                   super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                   .
                                   super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                   .
                                   super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                   ._M_head_impl.
                                   super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4);
        iVar24 = (int)((ulong)((long)*(pointer *)
                                      ((long)&(((_Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                                 *)&((begin._M_current)->
                                                                                                        
                                                  super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                                  ).
                                                  super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                               )->
                                              super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                              ).
                                              super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                              ._M_head_impl.
                                              super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                              ._M_impl.super__Vector_impl_data + 8) -
                              (long)(((_Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                       *)&((begin._M_current)->
                                          super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                          ).
                                          super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                     )->
                                    super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                    ).
                                    super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                    ._M_head_impl.
                                    super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4);
        auVar30._8_8_ =
             (((_Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                *)&((begin._M_current)->
                   super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                   ).
                   super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              )->
             super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
             ).super__Tuple_impl<2UL,_double,_int>.super__Head_base<2UL,_double,_false>._M_head_impl
        ;
        auVar30._0_8_ =
             local_b8.
             super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
             .
             super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
             .super__Tuple_impl<2UL,_double,_int>.super__Head_base<2UL,_double,_false>._M_head_impl;
        auVar38._8_8_ = *(comp.computeOverallScore)->bestscoretotal;
        auVar38._0_8_ = *(comp.computeOverallScore)->bestscoretotal;
        auVar28 = divpd(auVar30,auVar38);
        auVar39._0_8_ = (double)iVar3;
        auVar39._8_8_ = (double)iVar24;
        auVar22._0_8_ =
             (double)(iVar3 - (int)local_b8.
                                   super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                   .
                                   super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                   .super__Tuple_impl<2UL,_double,_int>.super__Tuple_impl<3UL,_int>.
                                   super__Head_base<3UL,_int,_false>._M_head_impl) * 0.5;
        auVar22._8_8_ =
             (double)(iVar24 - (((_Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                  *)&((begin._M_current)->
                                     super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                     ).
                                     super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                )->
                               super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                               ).super__Tuple_impl<2UL,_double,_int>.super__Tuple_impl<3UL,_int>.
                               super__Head_base<3UL,_int,_false>._M_head_impl) * 0.5;
        auVar20 = divpd(auVar22,auVar39);
        dVar25 = auVar28._0_8_ * 0.5 + auVar20._0_8_;
        dVar31 = auVar28._8_8_ * 0.5 + auVar20._8_8_;
        local_b8.
        super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        .super__Head_base<0UL,_int,_false>._M_head_impl =
             (&(begin._M_current)->
               super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
             )[1].super__Head_base<0UL,_int,_false>._M_head_impl;
        bVar2 = local_b8.
                super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                .super__Head_base<0UL,_int,_false>._M_head_impl <
                ((begin._M_current)->
                super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                ).super__Head_base<0UL,_int,_false>._M_head_impl;
        if (dVar25 != dVar31) {
          bVar2 = dVar31 < dVar25;
        }
        if (NAN(dVar25) || NAN(dVar31)) {
          bVar2 = dVar31 < dVar25;
        }
        if (bVar2) {
          local_b8.
          super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
          .
          super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
          .
          super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
          ._M_head_impl.
          super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               *(pointer *)
                ((long)&(((_Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                           *)&(&(begin._M_current)->
                                super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                              )[1].
                              super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                         )->
                        super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                        ).
                        super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                        ._M_head_impl.
                        super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                        ._M_impl.super__Vector_impl_data + 0x10);
          (((_Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
             *)&(&(begin._M_current)->
                  super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                )[1].
                super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
           )->
          super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
          ).
          super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
          ._M_head_impl.
          super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          *(pointer *)
           ((long)&(((_Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                      *)&(&(begin._M_current)->
                           super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                         )[1].
                         super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                    )->
                   super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                   ).
                   super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                   ._M_head_impl.
                   super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                   ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
          *(pointer *)
           ((long)&(((_Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                      *)&(&(begin._M_current)->
                           super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                         )[1].
                         super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                    )->
                   super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                   ).
                   super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                   ._M_head_impl.
                   super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                   ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
          p_Var7 = p_Var16;
          do {
            p_Var15 = p_Var7 + -1;
            std::
            tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
            ::operator=((tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                         *)p_Var7,(type)p_Var15);
            iVar3 = (int)((ulong)((long)local_b8.
                                        super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                        .
                                        super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                        .
                                        super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                        ._M_head_impl.
                                        super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_b8.
                                       super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                       .
                                       super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                       .
                                       super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                       ._M_head_impl.
                                       super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 4);
            iVar24 = (int)((ulong)((long)p_Var7[-2].
                                         super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                         .
                                         super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                         ._M_head_impl.
                                         super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)p_Var7[-2].
                                        super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                        .
                                        super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                        ._M_head_impl.
                                        super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 4);
            auVar18._8_8_ =
                 p_Var7[-2].
                 super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                 .super__Tuple_impl<2UL,_double,_int>.super__Head_base<2UL,_double,_false>.
                 _M_head_impl;
            auVar18._0_8_ =
                 local_b8.
                 super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                 .
                 super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                 .super__Tuple_impl<2UL,_double,_int>.super__Head_base<2UL,_double,_false>.
                 _M_head_impl;
            auVar40._8_8_ = *(comp.computeOverallScore)->bestscoretotal;
            auVar40._0_8_ = *(comp.computeOverallScore)->bestscoretotal;
            auVar20 = divpd(auVar18,auVar40);
            auVar41._0_8_ = (double)iVar3;
            auVar41._8_8_ = (double)iVar24;
            auVar23._0_8_ =
                 (double)(iVar3 - (int)local_b8.
                                       super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                       .
                                       super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                       .super__Tuple_impl<2UL,_double,_int>.
                                       super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>
                                       ._M_head_impl) * 0.5;
            auVar23._8_8_ =
                 (double)(iVar24 - p_Var7[-2].
                                   super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                   .super__Tuple_impl<2UL,_double,_int>.super__Tuple_impl<3UL,_int>.
                                   super__Head_base<3UL,_int,_false>._M_head_impl) * 0.5;
            auVar28 = divpd(auVar23,auVar41);
            dVar25 = auVar20._0_8_ * 0.5 + auVar28._0_8_;
            dVar31 = auVar20._8_8_ * 0.5 + auVar28._8_8_;
            bVar2 = local_b8.
                    super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                    .super__Head_base<0UL,_int,_false>._M_head_impl <
                    p_Var7[-2].super__Head_base<0UL,_int,_false>._M_head_impl;
            if (dVar25 != dVar31) {
              bVar2 = dVar31 < dVar25;
            }
            if (NAN(dVar25) || NAN(dVar31)) {
              bVar2 = dVar31 < dVar25;
            }
            p_Var7 = p_Var15;
          } while (bVar2);
          std::
          tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
          ::operator=((tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                       *)p_Var15,&local_b8);
          if (local_b8.
              super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              .
              super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              .
              super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
              ._M_head_impl.
              super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_b8.
                            super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                            .
                            super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                            .
                            super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                            ._M_head_impl.
                            super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
        }
        p_Var7 = p_Var16 + 1;
        begin._M_current =
             (tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              *)p_Var16;
      } while (p_Var16 + 1 !=
               &(end._M_current)->
                super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              );
      return;
    }
  }
  else {
    local_78._M_current = end._M_current + -1;
    local_40._M_current = end._M_current + -2;
    local_48._M_current = end._M_current + -3;
    b._M_current = begin._M_current;
    local_80._M_comp.computeOverallScore =
         (anon_class_8_1_d757357c)(anon_class_8_1_d757357c)comp.computeOverallScore;
    do {
      auVar20._8_8_ = 0;
      auVar20._0_8_ = uVar13;
      local_68 = SUB168(auVar20 * ZEXT816(0xaaaaaaaaaaaaaaab),8);
      uVar8 = uVar13 / 0x60;
      _Var6._M_current = b._M_current + uVar8;
      local_58 = b._M_current;
      if (uVar13 < 0x1801) {
        sort3<__gnu_cxx::__normal_iterator<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>*,std::vector<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>,std::allocator<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>>>>,presolve::HPresolve::liftingForProbing(presolve::HighsPostsolveStack&)::__4>
                  (_Var6,b,local_78,comp);
      }
      else {
        sort3<__gnu_cxx::__normal_iterator<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>*,std::vector<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>,std::allocator<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>>>>,presolve::HPresolve::liftingForProbing(presolve::HighsPostsolveStack&)::__4>
                  (b,_Var6,local_78,comp);
        sort3<__gnu_cxx::__normal_iterator<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>*,std::vector<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>,std::allocator<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>>>>,presolve::HPresolve::liftingForProbing(presolve::HighsPostsolveStack&)::__4>
                  (b._M_current + 1,b._M_current + (uVar8 - 1),local_40,comp);
        sort3<__gnu_cxx::__normal_iterator<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>*,std::vector<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>,std::allocator<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>>>>,presolve::HPresolve::liftingForProbing(presolve::HighsPostsolveStack&)::__4>
                  (b._M_current + 2,b._M_current + uVar8 + 1,local_48,comp);
        sort3<__gnu_cxx::__normal_iterator<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>*,std::vector<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>,std::allocator<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>>>>,presolve::HPresolve::liftingForProbing(presolve::HighsPostsolveStack&)::__4>
                  (b._M_current + (uVar8 - 1),_Var6,b._M_current + uVar8 + 1,comp);
        std::
        _Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        ::_M_swap(&(b._M_current)->
                   super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                  ,&(_Var6._M_current)->
                    super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                 );
      }
      local_b8.
      super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
      .
      super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
      .super__Tuple_impl<2UL,_double,_int>.super__Tuple_impl<3UL,_int>.
      super__Head_base<3UL,_int,_false>._M_head_impl =
           (_Head_base<3UL,_int,_false>)
           ((b._M_current)->
           super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
           ).
           super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
           .super__Tuple_impl<2UL,_double,_int>.super__Tuple_impl<3UL,_int>.
           super__Head_base<3UL,_int,_false>._M_head_impl;
      if ((leftmost & 1U) == 0) {
        local_b8.
        super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        .
        super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        .super__Tuple_impl<2UL,_double,_int>.super__Head_base<2UL,_double,_false>._M_head_impl =
             ((b._M_current)->
             super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
             ).
             super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
             .super__Tuple_impl<2UL,_double,_int>.super__Head_base<2UL,_double,_false>._M_head_impl;
        local_b8.
        super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        .
        super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        .
        super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
        ._M_head_impl.
        super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             *(pointer *)
              ((long)&((b._M_current)->
                      super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                      ).
                      super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                      .
                      super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                      ._M_head_impl.
                      super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                      ._M_impl.super__Vector_impl_data + 8);
        local_b8.
        super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        .
        super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        .
        super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
        ._M_head_impl.
        super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             ((b._M_current)->
             super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
             ).
             super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
             .
             super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
             ._M_head_impl.
             super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        iVar3 = (int)((ulong)((long)*(pointer *)
                                     ((long)&b._M_current[-1].
                                             super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                             .
                                             super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                             .
                                             super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                             ._M_head_impl.
                                             super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                             ._M_impl.super__Vector_impl_data + 8) -
                             (long)b._M_current[-1].
                                   super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                   .
                                   super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                   .
                                   super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                   ._M_head_impl.
                                   super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4);
        iVar24 = (int)((ulong)((long)local_b8.
                                     super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                     .
                                     super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                     .
                                     super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                     ._M_head_impl.
                                     super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_b8.
                                    super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                    .
                                    super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                    .
                                    super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                    ._M_head_impl.
                                    super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4);
        auVar36._8_8_ =
             local_b8.
             super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
             .
             super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
             .super__Tuple_impl<2UL,_double,_int>.super__Head_base<2UL,_double,_false>._M_head_impl;
        auVar36._0_8_ =
             b._M_current[-1].
             super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
             .
             super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
             .super__Tuple_impl<2UL,_double,_int>.super__Head_base<2UL,_double,_false>._M_head_impl;
        auVar37._8_8_ = *(comp.computeOverallScore)->bestscoretotal;
        auVar37._0_8_ = *(comp.computeOverallScore)->bestscoretotal;
        auVar37 = divpd(auVar36,auVar37);
        auVar29._0_8_ =
             (double)(iVar3 - b._M_current[-1].
                              super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                              .
                              super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                              .super__Tuple_impl<2UL,_double,_int>.super__Tuple_impl<3UL,_int>.
                              super__Head_base<3UL,_int,_false>._M_head_impl) * 0.5;
        auVar29._8_8_ =
             (double)(iVar24 - (int)local_b8.
                                    super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                    .
                                    super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                    .super__Tuple_impl<2UL,_double,_int>.super__Tuple_impl<3UL,_int>
                                    .super__Head_base<3UL,_int,_false>._M_head_impl) * 0.5;
        auVar28._8_8_ = (double)iVar24;
        auVar28._0_8_ = (double)iVar3;
        auVar20 = divpd(auVar29,auVar28);
        dVar31 = auVar37._0_8_ * 0.5 + auVar20._0_8_;
        dVar25 = auVar20._8_8_;
        dVar26 = auVar37._8_8_ * 0.5 + dVar25;
        local_b8.
        super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        .super__Head_base<0UL,_int,_false>._M_head_impl =
             ((b._M_current)->
             super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
             ).super__Head_base<0UL,_int,_false>._M_head_impl;
        bVar2 = b._M_current[-1].
                super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                .super__Head_base<0UL,_int,_false>._M_head_impl <
                local_b8.
                super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                .super__Head_base<0UL,_int,_false>._M_head_impl;
        if (dVar31 != dVar26) {
          bVar2 = dVar26 < dVar31;
        }
        if (NAN(dVar31) || NAN(dVar26)) {
          bVar2 = dVar26 < dVar31;
        }
        if (bVar2) goto LAB_0031b56a;
        local_b8.
        super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        .
        super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        .
        super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
        ._M_head_impl.
        super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             *(pointer *)
              ((long)&((b._M_current)->
                      super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                      ).
                      super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                      .
                      super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                      ._M_head_impl.
                      super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                      ._M_impl.super__Vector_impl_data + 0x10);
        ((b._M_current)->
        super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        ).
        super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        .
        super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
        ._M_head_impl.
        super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        *(pointer *)
         ((long)&((b._M_current)->
                 super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                 ).
                 super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                 .
                 super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                 ._M_head_impl.
                 super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                 ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
        *(pointer *)
         ((long)&((b._M_current)->
                 super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                 ).
                 super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                 .
                 super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                 ._M_head_impl.
                 super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                 ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
        dVar31 = *(comp.computeOverallScore)->bestscoretotal;
        dVar25 = (local_b8.
                  super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                  .
                  super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                  .super__Tuple_impl<2UL,_double,_int>.super__Head_base<2UL,_double,_false>.
                  _M_head_impl / dVar31) * 0.5 + dVar25;
        lVar12 = 0;
        do {
          lVar5 = lVar12;
          iVar3 = (int)((ulong)(*(long *)((long)end._M_current + lVar5 + -0x18) -
                               *(long *)((long)end._M_current + lVar5 + -0x20)) >> 4);
          dVar26 = (*(double *)((long)end._M_current + lVar5 + -0x28) / dVar31) * 0.5 +
                   ((double)(iVar3 - *(int *)((long)&end._M_current[-1].
                                                                                                          
                                                  super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                                  .
                                                  super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                                  .super__Tuple_impl<2UL,_double,_int>.
                                                  super__Tuple_impl<3UL,_int>.
                                                  super__Head_base<3UL,_int,_false>._M_head_impl +
                                             lVar5)) * 0.5) / (double)iVar3;
          bVar2 = local_b8.
                  super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                  .super__Head_base<0UL,_int,_false>._M_head_impl <
                  *(int *)((long)end._M_current + lVar5 + -8);
          if (dVar25 != dVar26) {
            bVar2 = dVar26 < dVar25;
          }
          if (NAN(dVar25) || NAN(dVar26)) {
            bVar2 = dVar26 < dVar25;
          }
          lVar12 = lVar5 + -0x30;
        } while (bVar2);
        p_Var7 = (_Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                  *)((long)&end._M_current[-1].
                            super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                            .
                            super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                            .super__Tuple_impl<2UL,_double,_int>.super__Tuple_impl<3UL,_int>.
                            super__Head_base<3UL,_int,_false>._M_head_impl + lVar5);
        _Var4._M_current = b._M_current;
        _Var6._M_current = b._M_current;
        if (lVar5 + -0x30 == -0x30) {
          do {
            _Var6._M_current = _Var4._M_current;
            if (p_Var7 <= _Var4._M_current) break;
            _Var6._M_current =
                 (tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                  *)(&(_Var4._M_current)->
                      super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                    + 1);
            iVar3 = (int)((ulong)((long)(&(_Var4._M_current)->
                                          super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                        )[1].
                                        super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                        .
                                        super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                        ._M_head_impl.
                                        super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(&(_Var4._M_current)->
                                         super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                       )[1].
                                       super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                       .
                                       super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                       ._M_head_impl.
                                       super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 4);
            dVar26 = ((&(_Var4._M_current)->
                        super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                      )[1].
                      super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                      .super__Tuple_impl<2UL,_double,_int>.super__Head_base<2UL,_double,_false>.
                      _M_head_impl / dVar31) * 0.5 +
                     ((double)(iVar3 - (&(_Var4._M_current)->
                                         super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                       )[1].
                                       super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                       .super__Tuple_impl<2UL,_double,_int>.
                                       super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>
                                       ._M_head_impl) * 0.5) / (double)iVar3;
            bVar2 = local_b8.
                    super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                    .super__Head_base<0UL,_int,_false>._M_head_impl <
                    (&(_Var4._M_current)->
                      super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                    )[1].super__Head_base<0UL,_int,_false>._M_head_impl;
            if (dVar25 != dVar26) {
              bVar2 = dVar26 < dVar25;
            }
            if (NAN(dVar25) || NAN(dVar26)) {
              bVar2 = dVar26 < dVar25;
            }
            _Var4._M_current = _Var6._M_current;
          } while (!bVar2);
        }
        else {
          do {
            iVar3 = (int)((ulong)((long)*(pointer *)
                                         ((long)&(((
                                                  _Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                                  *)&(&(_Var6._M_current)->
                                                                                                              
                                                  super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                                  )[1].
                                                  super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                                  )->
                                                 super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                                 ).
                                                 super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                                 ._M_head_impl.
                                                 super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                                 ._M_impl.super__Vector_impl_data + 8) -
                                 (long)(((_Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                          *)&(&(_Var6._M_current)->
                                               super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                             )[1].
                                             super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                        )->
                                       super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                       ).
                                       super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                       ._M_head_impl.
                                       super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 4);
            dVar26 = ((((_Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                         *)&(&(_Var6._M_current)->
                              super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                            )[1].
                            super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                       )->
                      super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                      ).super__Tuple_impl<2UL,_double,_int>.super__Head_base<2UL,_double,_false>.
                      _M_head_impl / dVar31) * 0.5 +
                     ((double)(iVar3 - (((_Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                          *)&(&(_Var6._M_current)->
                                               super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                             )[1].
                                             super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                        )->
                                       super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                       ).super__Tuple_impl<2UL,_double,_int>.
                                       super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>
                                       ._M_head_impl) * 0.5) / (double)iVar3;
            bVar2 = local_b8.
                    super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                    .super__Head_base<0UL,_int,_false>._M_head_impl <
                    (&(_Var6._M_current)->
                      super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                    )[1].super__Head_base<0UL,_int,_false>._M_head_impl;
            if (dVar25 != dVar26) {
              bVar2 = dVar26 < dVar25;
            }
            _Var6._M_current =
                 (tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                  *)(&(_Var6._M_current)->
                      super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                    + 1);
            if (NAN(dVar25) || NAN(dVar26)) {
              bVar2 = dVar26 < dVar25;
            }
          } while (!bVar2);
        }
        while (_Var6._M_current < p_Var7) {
          std::
          _Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
          ::_M_swap(&(_Var6._M_current)->
                     super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                    ,p_Var7);
          dVar25 = *(comp.computeOverallScore)->bestscoretotal;
          iVar3 = (int)((ulong)((long)local_b8.
                                      super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                      .
                                      super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                      .
                                      super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                      ._M_head_impl.
                                      super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_b8.
                                     super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                     .
                                     super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                     .
                                     super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                     ._M_head_impl.
                                     super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 4);
          dVar31 = (local_b8.
                    super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                    .
                    super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                    .super__Tuple_impl<2UL,_double,_int>.super__Head_base<2UL,_double,_false>.
                    _M_head_impl / dVar25) * 0.5 +
                   ((double)(iVar3 - (int)local_b8.
                                          super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                          .
                                          super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                          .super__Tuple_impl<2UL,_double,_int>.
                                          super__Tuple_impl<3UL,_int>.
                                          super__Head_base<3UL,_int,_false>._M_head_impl) * 0.5) /
                   (double)iVar3;
          do {
            iVar3 = (int)((ulong)((long)p_Var7[-1].
                                        super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                        .
                                        super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                        ._M_head_impl.
                                        super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)p_Var7[-1].
                                       super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                       .
                                       super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                       ._M_head_impl.
                                       super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 4);
            dVar26 = (p_Var7[-1].
                      super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                      .super__Tuple_impl<2UL,_double,_int>.super__Head_base<2UL,_double,_false>.
                      _M_head_impl / dVar25) * 0.5 +
                     ((double)(iVar3 - p_Var7[-1].
                                       super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                       .super__Tuple_impl<2UL,_double,_int>.
                                       super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>
                                       ._M_head_impl) * 0.5) / (double)iVar3;
            bVar2 = local_b8.
                    super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                    .super__Head_base<0UL,_int,_false>._M_head_impl <
                    p_Var7[-1].super__Head_base<0UL,_int,_false>._M_head_impl;
            if (dVar31 != dVar26) {
              bVar2 = dVar26 < dVar31;
            }
            p_Var7 = p_Var7 + -1;
            if (NAN(dVar31) || NAN(dVar26)) {
              bVar2 = dVar26 < dVar31;
            }
          } while (bVar2);
          do {
            iVar3 = (int)((ulong)((long)(&(_Var6._M_current)->
                                          super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                        )[1].
                                        super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                        .
                                        super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                        ._M_head_impl.
                                        super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(&(_Var6._M_current)->
                                         super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                       )[1].
                                       super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                       .
                                       super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                       ._M_head_impl.
                                       super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 4);
            dVar26 = ((&(_Var6._M_current)->
                        super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                      )[1].
                      super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                      .super__Tuple_impl<2UL,_double,_int>.super__Head_base<2UL,_double,_false>.
                      _M_head_impl / dVar25) * 0.5 +
                     ((double)(iVar3 - (&(_Var6._M_current)->
                                         super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                       )[1].
                                       super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                       .super__Tuple_impl<2UL,_double,_int>.
                                       super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>
                                       ._M_head_impl) * 0.5) / (double)iVar3;
            bVar2 = local_b8.
                    super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                    .super__Head_base<0UL,_int,_false>._M_head_impl <
                    (&(_Var6._M_current)->
                      super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                    )[1].super__Head_base<0UL,_int,_false>._M_head_impl;
            if (dVar31 != dVar26) {
              bVar2 = dVar26 < dVar31;
            }
            _Var6._M_current =
                 (tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                  *)(&(_Var6._M_current)->
                      super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                    + 1);
            if (NAN(dVar31) || NAN(dVar26)) {
              bVar2 = dVar26 < dVar31;
            }
          } while (!bVar2);
        }
        std::
        tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        ::operator=(b._M_current,(type)p_Var7);
        std::
        tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        ::operator=((tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                     *)p_Var7,&local_b8);
        if (local_b8.
            super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
            .
            super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
            .
            super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
            ._M_head_impl.
            super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_b8.
                          super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                          .
                          super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                          .
                          super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                          ._M_head_impl.
                          super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        begin._M_current =
             (tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              *)(p_Var7 + 1);
        uVar13 = (long)end._M_current - (long)begin._M_current;
      }
      else {
        local_b8.
        super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        .
        super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        .super__Tuple_impl<2UL,_double,_int>.super__Head_base<2UL,_double,_false>._M_head_impl =
             ((b._M_current)->
             super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
             ).
             super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
             .super__Tuple_impl<2UL,_double,_int>.super__Head_base<2UL,_double,_false>._M_head_impl;
        local_b8.
        super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        .
        super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        .
        super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
        ._M_head_impl.
        super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             ((b._M_current)->
             super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
             ).
             super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
             .
             super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
             ._M_head_impl.
             super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_b8.
        super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        .
        super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        .
        super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
        ._M_head_impl.
        super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             *(pointer *)
              ((long)&((b._M_current)->
                      super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                      ).
                      super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                      .
                      super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                      ._M_head_impl.
                      super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                      ._M_impl.super__Vector_impl_data + 8);
        local_b8.
        super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        .super__Head_base<0UL,_int,_false>._M_head_impl =
             ((b._M_current)->
             super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
             ).super__Head_base<0UL,_int,_false>._M_head_impl;
        iVar3 = (int)((ulong)((long)local_b8.
                                    super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                    .
                                    super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                    .
                                    super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                    ._M_head_impl.
                                    super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_b8.
                                   super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                   .
                                   super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                   .
                                   super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                   ._M_head_impl.
                                   super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4);
        dVar25 = ((double)(iVar3 - (int)local_b8.
                                        super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                        .
                                        super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                        .super__Tuple_impl<2UL,_double,_int>.
                                        super__Tuple_impl<3UL,_int>.
                                        super__Head_base<3UL,_int,_false>._M_head_impl) * 0.5) /
                 (double)iVar3;
LAB_0031b56a:
        local_68 = (pointer)((ulong)local_68 >> 5);
        local_b8.
        super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        .
        super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        .
        super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
        ._M_head_impl.
        super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             *(pointer *)
              ((long)&((b._M_current)->
                      super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                      ).
                      super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                      .
                      super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                      ._M_head_impl.
                      super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                      ._M_impl.super__Vector_impl_data + 0x10);
        ((b._M_current)->
        super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        ).
        super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        .
        super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
        ._M_head_impl.
        super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        *(pointer *)
         ((long)&((b._M_current)->
                 super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                 ).
                 super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                 .
                 super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                 ._M_head_impl.
                 super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                 ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
        *(pointer *)
         ((long)&((b._M_current)->
                 super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                 ).
                 super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                 .
                 super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                 ._M_head_impl.
                 super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                 ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
        dVar31 = *(comp.computeOverallScore)->bestscoretotal;
        dVar25 = (local_b8.
                  super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                  .
                  super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                  .super__Tuple_impl<2UL,_double,_int>.super__Head_base<2UL,_double,_false>.
                  _M_head_impl / dVar31) * 0.5 + dVar25;
        lVar5 = 0x30;
        lVar12 = 0;
        do {
          iVar3 = (int)((ulong)(*(long *)((long)&((b._M_current)->
                                                 super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                                 ).
                                                 super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                                 .
                                                 super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                                 ._M_head_impl.
                                                 super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                                 ._M_impl.super__Vector_impl_data + lVar5 + 8) -
                               *(long *)((long)&((b._M_current)->
                                                super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                                ).
                                                super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                                .
                                                super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                                ._M_head_impl.
                                                super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                                ._M_impl.super__Vector_impl_data + lVar5)) >> 4);
          dVar26 = (*(double *)
                     ((long)&((b._M_current)->
                             super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                             ).
                             super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                             .super__Tuple_impl<2UL,_double,_int>.
                             super__Head_base<2UL,_double,_false>._M_head_impl + lVar5) / dVar31) *
                   0.5 + ((double)(iVar3 - *(int *)((long)&((b._M_current)->
                                                                                                                      
                                                  super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                                  ).
                                                  super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                                  .super__Tuple_impl<2UL,_double,_int>.
                                                  super__Tuple_impl<3UL,_int>.
                                                  super__Head_base<3UL,_int,_false>._M_head_impl +
                                                  lVar5)) * 0.5) / (double)iVar3;
          bVar2 = *(int *)((long)&((b._M_current)->
                                  super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                  ).super__Head_base<0UL,_int,_false>._M_head_impl + lVar5) <
                  local_b8.
                  super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                  .super__Head_base<0UL,_int,_false>._M_head_impl;
          if (dVar26 != dVar25) {
            bVar2 = dVar25 < dVar26;
          }
          if (NAN(dVar26) || NAN(dVar25)) {
            bVar2 = dVar25 < dVar26;
          }
          lVar12 = lVar12 + -0x30;
          lVar5 = lVar5 + 0x30;
        } while (bVar2);
        begin._M_current =
             (tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              *)((long)b._M_current - lVar12);
        _Var4._M_current = end._M_current;
        _Var6._M_current = end._M_current;
        if (lVar12 == -0x30) {
          do {
            _Var6._M_current = _Var4._M_current;
            if (_Var4._M_current <= begin._M_current) break;
            _Var6._M_current =
                 (tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                  *)(&(_Var4._M_current)->
                      super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                    + -1);
            iVar3 = (int)((ulong)((long)*(pointer *)
                                         ((long)&(((
                                                  _Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                                  *)&(&(_Var4._M_current)->
                                                                                                              
                                                  super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                                  )[-1].
                                                  super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                                  )->
                                                 super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                                 ).
                                                 super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                                 ._M_head_impl.
                                                 super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                                 ._M_impl.super__Vector_impl_data + 8) -
                                 (long)(((_Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                          *)&(&(_Var4._M_current)->
                                               super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                             )[-1].
                                             super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                        )->
                                       super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                       ).
                                       super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                       ._M_head_impl.
                                       super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 4);
            dVar26 = ((((_Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                         *)&(&(_Var4._M_current)->
                              super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                            )[-1].
                            super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                       )->
                      super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                      ).super__Tuple_impl<2UL,_double,_int>.super__Head_base<2UL,_double,_false>.
                      _M_head_impl / dVar31) * 0.5 +
                     ((double)(iVar3 - (((_Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                          *)&(&(_Var4._M_current)->
                                               super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                             )[-1].
                                             super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                        )->
                                       super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                       ).super__Tuple_impl<2UL,_double,_int>.
                                       super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>
                                       ._M_head_impl) * 0.5) / (double)iVar3;
            bVar2 = (&(_Var4._M_current)->
                      super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                    )[-1].super__Head_base<0UL,_int,_false>._M_head_impl <
                    local_b8.
                    super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                    .super__Head_base<0UL,_int,_false>._M_head_impl;
            if (dVar26 != dVar25) {
              bVar2 = dVar25 < dVar26;
            }
            if (NAN(dVar26) || NAN(dVar25)) {
              bVar2 = dVar25 < dVar26;
            }
            _Var4._M_current = _Var6._M_current;
          } while (!bVar2);
        }
        else {
          do {
            iVar3 = (int)((ulong)((long)*(pointer *)
                                         ((long)&(((
                                                  _Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                                  *)&(&(_Var6._M_current)->
                                                                                                              
                                                  super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                                  )[-1].
                                                  super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                                  )->
                                                 super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                                 ).
                                                 super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                                 ._M_head_impl.
                                                 super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                                 ._M_impl.super__Vector_impl_data + 8) -
                                 (long)(((_Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                          *)&(&(_Var6._M_current)->
                                               super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                             )[-1].
                                             super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                        )->
                                       super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                       ).
                                       super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                       ._M_head_impl.
                                       super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 4);
            dVar26 = ((((_Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                         *)&(&(_Var6._M_current)->
                              super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                            )[-1].
                            super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                       )->
                      super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                      ).super__Tuple_impl<2UL,_double,_int>.super__Head_base<2UL,_double,_false>.
                      _M_head_impl / dVar31) * 0.5 +
                     ((double)(iVar3 - (((_Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                          *)&(&(_Var6._M_current)->
                                               super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                             )[-1].
                                             super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                        )->
                                       super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                       ).super__Tuple_impl<2UL,_double,_int>.
                                       super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>
                                       ._M_head_impl) * 0.5) / (double)iVar3;
            bVar2 = (&(_Var6._M_current)->
                      super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                    )[-1].super__Head_base<0UL,_int,_false>._M_head_impl <
                    local_b8.
                    super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                    .super__Head_base<0UL,_int,_false>._M_head_impl;
            if (dVar26 != dVar25) {
              bVar2 = dVar25 < dVar26;
            }
            _Var6._M_current =
                 (tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                  *)(&(_Var6._M_current)->
                      super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                    + -1);
            if (NAN(dVar26) || NAN(dVar25)) {
              bVar2 = dVar25 < dVar26;
            }
          } while (!bVar2);
        }
        p_Var7 = &(_Var6._M_current)->
                  super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        ;
        local_38 = (_Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                    *)begin._M_current;
        if (begin._M_current < _Var6._M_current) {
          do {
            std::
            _Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
            ::_M_swap(&(begin._M_current)->
                       super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                      ,p_Var7);
            dVar25 = *(comp.computeOverallScore)->bestscoretotal;
            iVar3 = (int)((ulong)((long)local_b8.
                                        super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                        .
                                        super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                        .
                                        super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                        ._M_head_impl.
                                        super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_b8.
                                       super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                       .
                                       super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                       .
                                       super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                       ._M_head_impl.
                                       super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 4);
            dVar31 = (local_b8.
                      super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                      .
                      super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                      .super__Tuple_impl<2UL,_double,_int>.super__Head_base<2UL,_double,_false>.
                      _M_head_impl / dVar25) * 0.5 +
                     ((double)(iVar3 - (int)local_b8.
                                            super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                            .
                                            super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                            .super__Tuple_impl<2UL,_double,_int>.
                                            super__Tuple_impl<3UL,_int>.
                                            super__Head_base<3UL,_int,_false>._M_head_impl) * 0.5) /
                     (double)iVar3;
            do {
              iVar3 = (int)((ulong)((long)*(pointer *)
                                           ((long)&(((
                                                  _Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                                  *)&(&(begin._M_current)->
                                                                                                              
                                                  super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                                  )[1].
                                                  super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                                  )->
                                                  super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                                  ).
                                                  super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                                  ._M_head_impl.
                                                  super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                                  ._M_impl.super__Vector_impl_data + 8) -
                                   (long)(((_Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                            *)&(&(begin._M_current)->
                                                 super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                               )[1].
                                               super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                          )->
                                         super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                         ).
                                         super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                         ._M_head_impl.
                                         super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4);
              dVar26 = ((((_Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                           *)&(&(begin._M_current)->
                                super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                              )[1].
                              super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                         )->
                        super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                        ).super__Tuple_impl<2UL,_double,_int>.super__Head_base<2UL,_double,_false>.
                        _M_head_impl / dVar25) * 0.5 +
                       ((double)(iVar3 - (((_Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                            *)&(&(begin._M_current)->
                                                 super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                               )[1].
                                               super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                          )->
                                         super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                         ).super__Tuple_impl<2UL,_double,_int>.
                                         super__Tuple_impl<3UL,_int>.
                                         super__Head_base<3UL,_int,_false>._M_head_impl) * 0.5) /
                       (double)iVar3;
              bVar2 = (&(begin._M_current)->
                        super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                      )[1].super__Head_base<0UL,_int,_false>._M_head_impl <
                      local_b8.
                      super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                      .super__Head_base<0UL,_int,_false>._M_head_impl;
              if (dVar26 != dVar31) {
                bVar2 = dVar31 < dVar26;
              }
              begin._M_current =
                   (tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                    *)(&(begin._M_current)->
                        super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                      + 1);
              if (NAN(dVar26) || NAN(dVar31)) {
                bVar2 = dVar31 < dVar26;
              }
            } while (bVar2);
            do {
              iVar3 = (int)((ulong)((long)*(pointer *)
                                           ((long)&(((
                                                  _Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                                  *)&p_Var7[-1].
                                                                                                          
                                                  super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                                  )->
                                                  super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                                  ).
                                                  super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                                  ._M_head_impl.
                                                  super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                                  ._M_impl.super__Vector_impl_data + 8) -
                                   (long)(((_Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                            *)&p_Var7[-1].
                                               super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                          )->
                                         super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                         ).
                                         super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                         ._M_head_impl.
                                         super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4);
              dVar26 = ((((_Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                           *)&p_Var7[-1].
                              super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                         )->
                        super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                        ).super__Tuple_impl<2UL,_double,_int>.super__Head_base<2UL,_double,_false>.
                        _M_head_impl / dVar25) * 0.5 +
                       ((double)(iVar3 - (((_Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                            *)&p_Var7[-1].
                                               super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                          )->
                                         super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                         ).super__Tuple_impl<2UL,_double,_int>.
                                         super__Tuple_impl<3UL,_int>.
                                         super__Head_base<3UL,_int,_false>._M_head_impl) * 0.5) /
                       (double)iVar3;
              bVar2 = p_Var7[-1].super__Head_base<0UL,_int,_false>._M_head_impl <
                      local_b8.
                      super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                      .super__Head_base<0UL,_int,_false>._M_head_impl;
              if (dVar26 != dVar31) {
                bVar2 = dVar31 < dVar26;
              }
              p_Var7 = p_Var7 + -1;
              if (NAN(dVar26) || NAN(dVar31)) {
                bVar2 = dVar31 < dVar26;
              }
            } while (!bVar2);
          } while (begin._M_current < p_Var7);
        }
        _Var4._M_current = begin._M_current + -1;
        std::
        tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        ::operator=(b._M_current,_Var4._M_current);
        std::
        tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        ::operator=(_Var4._M_current,&local_b8);
        if (local_b8.
            super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
            .
            super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
            .
            super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
            ._M_head_impl.
            super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_b8.
                          super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                          .
                          super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                          .
                          super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                          ._M_head_impl.
                          super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        comp.computeOverallScore = (anon_class_8_1_0b815314 *)local_80._M_comp.computeOverallScore;
        uVar13 = ((long)_Var4._M_current - (long)local_58 >> 4) * -0x5555555555555555;
        local_50 = (long)end._M_current - (long)begin._M_current;
        ppVar9 = (pointer)(((long)local_50 >> 4) * -0x5555555555555555);
        if (((long)uVar13 < (long)((ulong)local_68 >> 3)) ||
           ((long)ppVar9 < (long)((ulong)local_68 >> 3))) {
          local_6c = local_6c + -1;
          if (local_6c == 0) {
            uVar13 = (long)local_68 - 2U >> 1;
            p_Var11 = &b._M_current[uVar13].
                       super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                       .super__Head_base<0UL,_int,_false>;
            local_6c = 0;
            do {
              local_b8.
              super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              .
              super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              .super__Tuple_impl<2UL,_double,_int>.super__Tuple_impl<3UL,_int>.
              super__Head_base<3UL,_int,_false>._M_head_impl =
                   (_Head_base<3UL,_int,_false>)
                   (((_Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                      *)(p_Var11 + -10))->
                   super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                   ).super__Tuple_impl<2UL,_double,_int>.super__Tuple_impl<3UL,_int>.
                   super__Head_base<3UL,_int,_false>._M_head_impl;
              local_b8.
              super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              .
              super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              .super__Tuple_impl<2UL,_double,_int>.super__Head_base<2UL,_double,_false>._M_head_impl
                   = ((_Head_base<2UL,_double,_false> *)(p_Var11 + -8))->_M_head_impl;
              local_b8.
              super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              .
              super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              .
              super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
              ._M_head_impl.
              super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)(p_Var11 + -2);
              local_b8.
              super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              .
              super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              .
              super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
              ._M_head_impl.
              super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (((_Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                      *)(p_Var11 + -6))->_M_head_impl).
                   super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_b8.
              super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              .
              super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              .
              super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
              ._M_head_impl.
              super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)(p_Var11 + -4);
              (((_Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                 *)(p_Var11 + -6))->_M_head_impl).
              super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              *(pointer *)(p_Var11 + -4) = (pointer)0x0;
              *(pointer *)(p_Var11 + -2) = (pointer)0x0;
              local_b8.
              super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              .super__Head_base<0UL,_int,_false>._M_head_impl = p_Var11->_M_head_impl;
              std::
              __adjust_heap<__gnu_cxx::__normal_iterator<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>*,std::vector<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>,std::allocator<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>>>>,long,std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>,__gnu_cxx::__ops::_Iter_comp_iter<presolve::HPresolve::liftingForProbing(presolve::HighsPostsolveStack&)::__4>>
                        (b,uVar13,(long)local_68,&local_b8,
                         (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_presolve_HPresolve_cpp:1830:7)>
                          )comp.computeOverallScore);
              if (local_b8.
                  super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                  .
                  super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                  .
                  super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                  ._M_head_impl.
                  super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_b8.
                                super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                .
                                super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                .
                                super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                ._M_head_impl.
                                super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
              }
              p_Var11 = p_Var11 + -0xc;
              bVar2 = uVar13 != 0;
              uVar13 = uVar13 - 1;
            } while (bVar2);
            local_c8 = (long)end._M_current - (long)local_58;
            do {
              _Var1._M_head_impl =
                   ((local_78._M_current)->
                   super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                   ).
                   super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                   .super__Tuple_impl<2UL,_double,_int>.super__Tuple_impl<3UL,_int>.
                   super__Head_base<3UL,_int,_false>._M_head_impl;
              dVar25 = ((local_78._M_current)->
                       super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                       ).
                       super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                       .super__Tuple_impl<2UL,_double,_int>.super__Head_base<2UL,_double,_false>.
                       _M_head_impl;
              ppVar9 = ((local_78._M_current)->
                       super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                       ).
                       super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                       .
                       super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                       ._M_head_impl.
                       super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_c8 = local_c8 + -0x30;
              local_68 = ((local_78._M_current)->
                         super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                         ).
                         super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                         .
                         super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                         ._M_head_impl.
                         super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              ppStack_60 = ((local_78._M_current)->
                           super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                           ).
                           super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                           .
                           super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                           ._M_head_impl.
                           super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
              ((local_78._M_current)->
              super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              ).
              super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              .
              super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
              ._M_head_impl.
              super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              ((local_78._M_current)->
              super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              ).
              super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              .
              super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
              ._M_head_impl.
              super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              ((local_78._M_current)->
              super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              ).
              super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              .
              super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
              ._M_head_impl.
              super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              iVar3 = ((_Head_base<0UL,_int,_false> *)((long)local_78._M_current + 0x28))->
                      _M_head_impl;
              std::
              tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              ::operator=(local_78._M_current,b._M_current);
              local_b8.
              super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              .
              super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              .
              super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
              ._M_head_impl.
              super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_start = local_68;
              local_b8.
              super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              .
              super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              .
              super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
              ._M_head_impl.
              super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = ppStack_60;
              local_b8.
              super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              .
              super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              .super__Tuple_impl<2UL,_double,_int>.super__Tuple_impl<3UL,_int>.
              super__Head_base<3UL,_int,_false>._M_head_impl =
                   (_Head_base<3UL,_int,_false>)(_Head_base<3UL,_int,_false>)_Var1._M_head_impl;
              local_b8.
              super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              .
              super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              .super__Tuple_impl<2UL,_double,_int>.super__Head_base<2UL,_double,_false>._M_head_impl
                   = dVar25;
              local_b8.
              super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              .
              super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              .
              super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
              ._M_head_impl.
              super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar9;
              local_b8.
              super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              .super__Head_base<0UL,_int,_false>._M_head_impl = iVar3;
              std::
              __adjust_heap<__gnu_cxx::__normal_iterator<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>*,std::vector<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>,std::allocator<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>>>>,long,std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>,__gnu_cxx::__ops::_Iter_comp_iter<presolve::HPresolve::liftingForProbing(presolve::HighsPostsolveStack&)::__4>>
                        (b,0,(local_c8 >> 4) * -0x5555555555555555,&local_b8,local_80);
              if (local_b8.
                  super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                  .
                  super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                  .
                  super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                  ._M_head_impl.
                  super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_b8.
                                super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                .
                                super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                .
                                super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                ._M_head_impl.
                                super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
              }
              local_78._M_current = local_78._M_current + -1;
            } while (0x30 < local_c8);
            return;
          }
          if (0x450 < (long)_Var4._M_current - (long)local_58) {
            ptVar10 = (tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                       *)(uVar13 >> 2);
            local_68 = ppVar9;
            std::
            _Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
            ::_M_swap(&(b._M_current)->
                       super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                      ,&b._M_current[(long)ptVar10].
                        super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                     );
            local_58 = ptVar10;
            std::
            _Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
            ::_M_swap(&begin._M_current[-2].
                       super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                      ,&_Var4._M_current[-(long)ptVar10].
                        super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                     );
            ppVar9 = local_68;
            if (0x80 < uVar13) {
              std::
              _Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              ::_M_swap(&b._M_current[1].
                         super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                        ,&b._M_current
                          [(long)((long)&(ptVar10->
                                         super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                         ).
                                         super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                         .super__Tuple_impl<2UL,_double,_int>.
                                         super__Tuple_impl<3UL,_int>.
                                         super__Head_base<3UL,_int,_false>._M_head_impl + 1)].
                          super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                       );
              std::
              _Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              ::_M_swap(&b._M_current[2].
                         super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                        ,&b._M_current
                          [(long)((long)&(ptVar10->
                                         super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                         ).
                                         super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                         .super__Tuple_impl<2UL,_double,_int>.
                                         super__Tuple_impl<3UL,_int>.
                                         super__Head_base<3UL,_int,_false>._M_head_impl + 2)].
                          super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                       );
              ptVar10 = local_58;
              std::
              _Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              ::_M_swap(&begin._M_current[-3].
                         super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                        ,&_Var4._M_current[~(ulong)local_58].
                          super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                       );
              std::
              _Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              ::_M_swap(&begin._M_current[-4].
                         super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                        ,&_Var4._M_current[-2 - (long)ptVar10].
                          super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                       );
              ppVar9 = local_68;
            }
          }
          comp.computeOverallScore = (anon_class_8_1_0b815314 *)local_80;
          if (0x450 < (long)local_50) {
            uVar13 = (ulong)ppVar9 >> 2;
            std::
            _Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
            ::_M_swap(&(begin._M_current)->
                       super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                      ,&_Var4._M_current[uVar13 + 1].
                        super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                     );
            std::
            _Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
            ::_M_swap(&(local_78._M_current)->
                       super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                      ,&end._M_current[-uVar13].
                        super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                     );
            comp.computeOverallScore = (anon_class_8_1_0b815314 *)local_80;
            if (0x80 < ppVar9) {
              std::
              _Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              ::_M_swap(&begin._M_current[1].
                         super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                        ,&_Var4._M_current[uVar13 + 2].
                          super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                       );
              std::
              _Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              ::_M_swap(&begin._M_current[2].
                         super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                        ,&_Var4._M_current[uVar13 + 3].
                          super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                       );
              std::
              _Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              ::_M_swap(&(local_40._M_current)->
                         super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                        ,&end._M_current[~uVar13].
                          super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                       );
              comp.computeOverallScore = (anon_class_8_1_0b815314 *)local_80;
              std::
              _Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              ::_M_swap(&(local_48._M_current)->
                         super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                        ,&end._M_current[-2 - uVar13].
                          super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                       );
            }
          }
        }
        else if (((_Var6._M_current <= local_38) &&
                 (bVar2 = partial_insertion_sort<__gnu_cxx::__normal_iterator<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>*,std::vector<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>,std::allocator<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>>>>,presolve::HPresolve::liftingForProbing(presolve::HighsPostsolveStack&)::__4>
                                    (b,_Var4,local_80._M_comp.computeOverallScore), bVar2)) &&
                (bVar2 = partial_insertion_sort<__gnu_cxx::__normal_iterator<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>*,std::vector<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>,std::allocator<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>>>>,presolve::HPresolve::liftingForProbing(presolve::HighsPostsolveStack&)::__4>
                                   (begin,end,comp), bVar2)) {
          return;
        }
        pdqsort_loop<__gnu_cxx::__normal_iterator<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>*,std::vector<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>,std::allocator<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>>>>,presolve::HPresolve::liftingForProbing(presolve::HighsPostsolveStack&)::__4,false>
                  (b,_Var4,comp,local_6c,(bool)(leftmost & 1));
        leftmost = false;
        uVar13 = local_50;
      }
      b._M_current = begin._M_current;
    } while (0x47f < (long)uVar13);
    if ((leftmost & 1U) == 0) goto LAB_0031bdc6;
  }
  if ((begin._M_current != end._M_current) &&
     (p_Var7 = &(begin._M_current)->
                super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
               + 1,
     p_Var7 != &(end._M_current)->
                super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
     )) {
    lVar12 = 0;
    p_Var16 = &(begin._M_current)->
               super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
    ;
    do {
      local_b8.
      super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
      .
      super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
      .super__Tuple_impl<2UL,_double,_int>.super__Head_base<2UL,_double,_false>._M_head_impl =
           (((_Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              *)&p_Var16[1].
                 super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
            )->
           super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
           ).super__Tuple_impl<2UL,_double,_int>.super__Head_base<2UL,_double,_false>._M_head_impl;
      local_b8.
      super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
      .
      super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
      .
      super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
      ._M_head_impl.
      super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           *(pointer *)
            ((long)&(((_Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                       *)&p_Var16[1].
                          super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                     )->
                    super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                    ).
                    super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                    ._M_head_impl.
                    super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                    ._M_impl.super__Vector_impl_data + 8);
      local_b8.
      super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
      .
      super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
      .
      super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
      ._M_head_impl.
      super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (((_Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              *)&p_Var16[1].
                 super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
            )->
           super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
           ).
           super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
           ._M_head_impl.
           super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_b8.
      super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
      .
      super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
      .super__Tuple_impl<2UL,_double,_int>.super__Tuple_impl<3UL,_int>.
      super__Head_base<3UL,_int,_false>._M_head_impl =
           (_Head_base<3UL,_int,_false>)
           (((_Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              *)&p_Var7->
                 super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
            )->
           super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
           ).super__Tuple_impl<2UL,_double,_int>.super__Tuple_impl<3UL,_int>.
           super__Head_base<3UL,_int,_false>._M_head_impl;
      iVar3 = (int)((ulong)((long)local_b8.
                                  super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                  .
                                  super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                  .
                                  super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                  ._M_head_impl.
                                  super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_b8.
                                 super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                 .
                                 super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                 .
                                 super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                 ._M_head_impl.
                                 super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4);
      iVar24 = (int)((ulong)((long)*(pointer *)
                                    ((long)&(((_Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                               *)&p_Var16->
                                                  super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                             )->
                                            super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                            ).
                                            super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                            ._M_head_impl.
                                            super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                            ._M_impl.super__Vector_impl_data + 8) -
                            (long)(((_Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                     *)&p_Var16->
                                        super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                   )->
                                  super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                  ).
                                  super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                  ._M_head_impl.
                                  super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4);
      auVar27._8_8_ =
           (((_Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              *)&p_Var16->
                 super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
            )->
           super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
           ).super__Tuple_impl<2UL,_double,_int>.super__Head_base<2UL,_double,_false>._M_head_impl;
      auVar27._0_8_ =
           local_b8.
           super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
           .
           super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
           .super__Tuple_impl<2UL,_double,_int>.super__Head_base<2UL,_double,_false>._M_head_impl;
      auVar32._8_8_ = *(comp.computeOverallScore)->bestscoretotal;
      auVar32._0_8_ = *(comp.computeOverallScore)->bestscoretotal;
      auVar28 = divpd(auVar27,auVar32);
      auVar33._0_8_ = (double)iVar3;
      auVar33._8_8_ = (double)iVar24;
      auVar19._0_8_ =
           (double)(iVar3 - (int)local_b8.
                                 super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                 .
                                 super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                 .super__Tuple_impl<2UL,_double,_int>.super__Tuple_impl<3UL,_int>.
                                 super__Head_base<3UL,_int,_false>._M_head_impl) * 0.5;
      auVar19._8_8_ =
           (double)(iVar24 - (((_Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                *)&p_Var16->
                                   super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                              )->
                             super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                             ).super__Tuple_impl<2UL,_double,_int>.super__Tuple_impl<3UL,_int>.
                             super__Head_base<3UL,_int,_false>._M_head_impl) * 0.5;
      auVar20 = divpd(auVar19,auVar33);
      dVar25 = auVar28._0_8_ * 0.5 + auVar20._0_8_;
      dVar31 = auVar28._8_8_ * 0.5 + auVar20._8_8_;
      local_b8.
      super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
      .super__Head_base<0UL,_int,_false>._M_head_impl =
           p_Var16[1].super__Head_base<0UL,_int,_false>._M_head_impl;
      bVar2 = local_b8.
              super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              .super__Head_base<0UL,_int,_false>._M_head_impl <
              (p_Var16->super__Head_base<0UL,_int,_false>)._M_head_impl;
      if (dVar25 != dVar31) {
        bVar2 = dVar31 < dVar25;
      }
      if (NAN(dVar25) || NAN(dVar31)) {
        bVar2 = dVar31 < dVar25;
      }
      if (bVar2) {
        local_b8.
        super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        .
        super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        .
        super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
        ._M_head_impl.
        super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             *(pointer *)
              ((long)&(((_Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                         *)&p_Var16[1].
                            super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                       )->
                      super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                      ).
                      super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                      ._M_head_impl.
                      super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                      ._M_impl.super__Vector_impl_data + 0x10);
        (((_Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
           *)&p_Var16[1].
              super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
         )->
        super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        ).
        super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
        ._M_head_impl.
        super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        *(pointer *)
         ((long)&(((_Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                    *)&p_Var16[1].
                       super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                  )->
                 super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                 ).
                 super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                 ._M_head_impl.
                 super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                 ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
        *(pointer *)
         ((long)&(((_Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                    *)&p_Var16[1].
                       super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                  )->
                 super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                 ).
                 super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                 ._M_head_impl.
                 super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                 ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
        lVar5 = 0;
        do {
          lVar14 = lVar5;
          std::
          tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
          ::operator=((tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                       *)((long)&(((_Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                    *)&p_Var7->
                                       super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                  )->
                                 super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                 ).super__Tuple_impl<2UL,_double,_int>.super__Tuple_impl<3UL,_int>.
                                 super__Head_base<3UL,_int,_false>._M_head_impl + lVar14),
                      (type)((long)&(((_Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                       *)&p_Var16->
                                          super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                     )->
                                    super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                    ).super__Tuple_impl<2UL,_double,_int>.
                                    super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>.
                                    _M_head_impl + lVar14));
          p_Var15 = &(begin._M_current)->
                     super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
          ;
          if (lVar12 == lVar14) goto LAB_0031b32e;
          iVar3 = (int)((ulong)((long)local_b8.
                                      super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                      .
                                      super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                      .
                                      super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                      ._M_head_impl.
                                      super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_b8.
                                     super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                     .
                                     super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                     .
                                     super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                     ._M_head_impl.
                                     super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 4);
          iVar24 = (int)((ulong)(*(long *)((long)p_Var16 + lVar14 + -0x18) -
                                *(long *)((long)p_Var16 + lVar14 + -0x20)) >> 4);
          auVar17._8_8_ = *(undefined8 *)((long)p_Var16 + lVar14 + -0x28);
          auVar17._0_8_ =
               local_b8.
               super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
               .
               super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
               .super__Tuple_impl<2UL,_double,_int>.super__Head_base<2UL,_double,_false>.
               _M_head_impl;
          auVar34._8_8_ = *(comp.computeOverallScore)->bestscoretotal;
          auVar34._0_8_ = *(comp.computeOverallScore)->bestscoretotal;
          auVar20 = divpd(auVar17,auVar34);
          auVar35._0_8_ = (double)iVar3;
          auVar35._8_8_ = (double)iVar24;
          auVar21._0_8_ =
               (double)(iVar3 - (int)local_b8.
                                     super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                     .
                                     super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                     .super__Tuple_impl<2UL,_double,_int>.
                                     super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>.
                                     _M_head_impl) * 0.5;
          auVar21._8_8_ =
               (double)(iVar24 - *(int *)((long)&(((
                                                  _Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                                  *)&p_Var16[-1].
                                                                                                          
                                                  super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                                  )->
                                                 super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                                 ).super__Tuple_impl<2UL,_double,_int>.
                                                 super__Tuple_impl<3UL,_int>.
                                                 super__Head_base<3UL,_int,_false>._M_head_impl +
                                         lVar14)) * 0.5;
          auVar28 = divpd(auVar21,auVar35);
          dVar25 = auVar20._0_8_ * 0.5 + auVar28._0_8_;
          dVar31 = auVar20._8_8_ * 0.5 + auVar28._8_8_;
          bVar2 = local_b8.
                  super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                  .super__Head_base<0UL,_int,_false>._M_head_impl <
                  *(int *)((long)p_Var16 + lVar14 + -8);
          if (dVar25 != dVar31) {
            bVar2 = dVar31 < dVar25;
          }
          if (NAN(dVar25) || NAN(dVar31)) {
            bVar2 = dVar31 < dVar25;
          }
          lVar5 = lVar14 + -0x30;
        } while (bVar2);
        p_Var15 = (_Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                   *)((long)&(((_Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                *)&p_Var7[-1].
                                   super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                              )->
                             super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                             ).super__Tuple_impl<2UL,_double,_int>.super__Tuple_impl<3UL,_int>.
                             super__Head_base<3UL,_int,_false>._M_head_impl + lVar14);
LAB_0031b32e:
        std::
        tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        ::operator=((tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                     *)p_Var15,&local_b8);
        if (local_b8.
            super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
            .
            super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
            .
            super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
            ._M_head_impl.
            super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_b8.
                          super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                          .
                          super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                          .
                          super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                          ._M_head_impl.
                          super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      p_Var7 = p_Var7 + 1;
      lVar12 = lVar12 + -0x30;
      p_Var16 = p_Var16 + 1;
    } while (p_Var7 != &(end._M_current)->
                        super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
            );
  }
  return;
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }